

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O0

int pk_parse_key_pkcs8_unencrypted_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_pk_info_t *pmVar2;
  mbedtls_asn1_buf *in_RSI;
  mbedtls_pk_info_t *pk_info;
  int ec_grp_id;
  mbedtls_pk_type_t pk_alg;
  uchar *end;
  uchar *p;
  mbedtls_asn1_buf params;
  size_t len;
  int version;
  int ret;
  mbedtls_pk_context *in_stack_ffffffffffffff78;
  uchar **in_stack_ffffffffffffff80;
  uchar **in_stack_ffffffffffffff88;
  void *ec_grp_id_00;
  mbedtls_pk_type_t *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  uchar **in_stack_ffffffffffffffb8;
  long local_40;
  int local_38;
  int local_4;
  
  iVar1 = mbedtls_asn1_get_tag
                    (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,
                     (size_t *)in_stack_ffffffffffffff78,0);
  if (iVar1 == 0) {
    ec_grp_id_00 = (void *)((long)&in_RSI->tag + local_40);
    iVar1 = mbedtls_asn1_get_int
                      (in_stack_ffffffffffffff80,(uchar *)in_stack_ffffffffffffff78,(int *)0x87eef4)
    ;
    if (iVar1 == 0) {
      if (local_38 == 0) {
        local_4 = pk_get_pk_alg(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8,in_RSI,ec_grp_id_00);
        if (local_4 == 0) {
          iVar1 = mbedtls_asn1_get_tag
                            (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,
                             (size_t *)in_stack_ffffffffffffff78,0);
          if (iVar1 == 0) {
            if (local_40 == 0) {
              local_4 = mbedtls_error_add(-0x3d00,-0x60,
                                          "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                          ,0x322);
            }
            else {
              pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_NONE);
              if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
                local_4 = -0x3c80;
              }
              else {
                local_4 = mbedtls_pk_setup(in_stack_ffffffffffffff78,(mbedtls_pk_info_t *)0x87f031);
                if (local_4 == 0) {
                  local_4 = -0x3c80;
                }
              }
            }
          }
          else {
            local_4 = mbedtls_error_add(-0x3d00,iVar1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                        ,0x31d);
          }
        }
      }
      else {
        local_4 = mbedtls_error_add(-0x3d80,0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                    ,0x315);
      }
    }
    else {
      local_4 = mbedtls_error_add(-0x3d00,iVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                  ,0x311);
    }
  }
  else {
    local_4 = mbedtls_error_add(-0x3d00,iVar1,
                                "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                ,0x30b);
  }
  return local_4;
}

Assistant:

static int pk_parse_key_pkcs8_unencrypted_der(
    mbedtls_pk_context *pk,
    const unsigned char *key, size_t keylen,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret, version;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    int ec_grp_id = 0;
    const mbedtls_pk_info_t *pk_info;

#if !defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    (void) f_rng;
    (void) p_rng;
#endif

    /*
     * This function parses the PrivateKeyInfo object (PKCS#8 v1.2 = RFC 5208)
     *
     *    PrivateKeyInfo ::= SEQUENCE {
     *      version                   Version,
     *      privateKeyAlgorithm       PrivateKeyAlgorithmIdentifier,
     *      privateKey                PrivateKey,
     *      attributes           [0]  IMPLICIT Attributes OPTIONAL }
     *
     *    Version ::= INTEGER
     *    PrivateKeyAlgorithmIdentifier ::= AlgorithmIdentifier
     *    PrivateKey ::= OCTET STRING
     *
     *  The PrivateKey OCTET STRING is a SEC1 ECPrivateKey
     */

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = p + len;

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (version != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_VERSION, ret);
    }

    if ((ret = pk_get_pk_alg(&p, end, &pk_alg, &params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (len < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        if ((ret = mbedtls_rsa_parse_key(mbedtls_pk_rsa(*pk), p, len)) != 0) {
            mbedtls_pk_free(pk);
            return ret;
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY || pk_alg == MBEDTLS_PK_ECKEY_DH) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            if ((ret =
                     pk_use_ecparams_rfc8410(&params, ec_grp_id, pk)) != 0 ||
                (ret =
                     pk_parse_key_rfc8410_der(pk, p, len, end, f_rng,
                                              p_rng)) != 0) {
                mbedtls_pk_free(pk);
                return ret;
            }
        } else
#endif
        {
            if ((ret = pk_use_ecparams(&params, pk)) != 0 ||
                (ret = pk_parse_key_sec1_der(pk, p, len, f_rng, p_rng)) != 0) {
                mbedtls_pk_free(pk);
                return ret;
            }
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    end = p + len;
    if (end != (key + keylen)) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}